

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedInstancing::Run(AdvancedInstancing *this)

{
  CallLogWrapper *this_00;
  GLsizei GVar1;
  bool bVar2;
  GLuint GVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  VertexAttribBindingBase *this_01;
  int rw;
  long lVar7;
  float in_XMM2_Da;
  uint in_stack_fffffffffffffe84;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  Mat4 local_138;
  Mat4 local_f8;
  Mat4 local_b8 [2];
  
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_3ca331;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_210b71;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_3ca34a;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,3,(GLchar **)&fb);
  this->m_vsp = GVar3;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_3ca331;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_210b71;
  fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_3ca356;
  GVar3 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,3,(GLchar **)&fb);
  this->m_fsp = GVar3;
  bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_vsp);
  lVar7 = -1;
  if (bVar2) {
    bVar2 = VertexAttribBindingBase::CheckProgram(&this->super_VertexAttribBindingBase,this->m_fsp);
    if (bVar2) {
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,1,this->m_vsp);
      glu::CallLogWrapper::glUseProgramStages(this_00,this->m_pipeline,2,this->m_fsp);
      memcpy(&fb,&DAT_016ee800,0x140);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x140,&fb,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x100000000;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x100000000;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x300000002;
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8893,0x40,&fb,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x100000000;
      fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x300000002;
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_object_id_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&fb,0x88e4);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[0]);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,1,3,0x1406,'\0',8);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,2,1,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vertex_buffer,0,0x14);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,2,this->m_object_id_buffer,0,4);
      glu::CallLogWrapper::glVertexBindingDivisor(this_00,2,1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[1]);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,0,2,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribFormat(this_00,1,3,0x1406,'\0',0);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,2,1,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,2,0xd);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,1,0xe);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0xf);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0xf,this->m_vertex_buffer,0,0x14);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0xe,this->m_vertex_buffer,8,0x14);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,0xd,this->m_object_id_buffer,0,4);
      glu::CallLogWrapper::glVertexBindingDivisor(this_00,0xd,1);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
      this_01 = (VertexAttribBindingBase *)0x0;
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      VertexAttribBindingBase::Translation((Mat4 *)&fb,this_01,-0.5,-0.5,in_XMM2_Da);
      VertexAttribBindingBase::Translation(&local_138,this_01,0.5,-0.5,in_XMM2_Da);
      VertexAttribBindingBase::Translation(&local_f8,this_01,0.5,0.5,in_XMM2_Da);
      VertexAttribBindingBase::Translation(local_b8,this_01,-0.5,0.5,in_XMM2_Da);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_transform_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x100,&fb,0x88e8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,0);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_transform_texture);
      glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_transform_buffer);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,0);
      glu::CallLogWrapper::glClear(this_00,0x4000);
      glu::CallLogWrapper::glBindProgramPipeline(this_00,this->m_pipeline);
      glu::CallLogWrapper::glActiveTexture(this_00,0x84c0);
      glu::CallLogWrapper::glBindTexture(this_00,0x8c2a,this->m_transform_texture);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[0]);
      iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar4 = *(int *)CONCAT44(extraout_var,iVar4);
      iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                (&fb,(long)(iVar4 * *(int *)(CONCAT44(extraout_var_00,iVar5) + 4)),
                 (allocator_type *)&stack0xfffffffffffffe78);
      glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                (this_00,5,4,0x1405,(void *)0x0,1,0,0);
      iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      GVar1 = *(GLsizei *)CONCAT44(extraout_var_01,iVar4);
      iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      glu::CallLogWrapper::glReadPixels
                (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_02,iVar4) + 4),0x1907,0x1406,
                 fb.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar4 = *(int *)CONCAT44(extraout_var_03,iVar4);
      iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      iVar5 = *(int *)CONCAT44(extraout_var_04,iVar5);
      iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context)
                ->m_renderCtx->_vptr_RenderContext[4])();
      rw = (int)&stack0xfffffffffffffe78;
      bVar2 = VertexAttribBindingBase::CheckRectColor
                        (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                         *(int *)(CONCAT44(extraout_var_05,iVar6) + 4),rw,0x3f800000,
                         (Vec3 *)((ulong)in_stack_fffffffffffffe84 << 0x20));
      lVar7 = -1;
      if (bVar2) {
        glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                  (this_00,5,4,0x1405,(void *)0x10,1,4,1);
        iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        GVar1 = *(GLsizei *)CONCAT44(extraout_var_06,iVar4);
        iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        glu::CallLogWrapper::glReadPixels
                  (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_07,iVar4) + 4),0x1907,0x1406
                   ,fb.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
        iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        iVar4 = *(int *)CONCAT44(extraout_var_08,iVar4);
        iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        iVar5 = *(int *)CONCAT44(extraout_var_09,iVar5);
        iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.m_context
                  )->m_renderCtx->_vptr_RenderContext[4])();
        bVar2 = VertexAttribBindingBase::CheckRectColor
                          (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                           *(int *)(CONCAT44(extraout_var_10,iVar6) + 4),rw,0,
                           (Vec3 *)((ulong)in_stack_fffffffffffffe84 << 0x20));
        if (bVar2) {
          glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                    (this_00,5,4,0x1405,(void *)0x20,1,8,2);
          iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          GVar1 = *(GLsizei *)CONCAT44(extraout_var_11,iVar4);
          iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          glu::CallLogWrapper::glReadPixels
                    (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_12,iVar4) + 4),0x1907,
                     0x1406,fb.
                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar4 = *(int *)CONCAT44(extraout_var_13,iVar4);
          iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          iVar5 = *(int *)CONCAT44(extraout_var_14,iVar5);
          iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                    m_context)->m_renderCtx->_vptr_RenderContext[4])();
          bVar2 = VertexAttribBindingBase::CheckRectColor
                            (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                             *(int *)(CONCAT44(extraout_var_15,iVar6) + 4),rw,0,
                             (Vec3 *)CONCAT44(in_stack_fffffffffffffe84,0x3f800000));
          if (bVar2) {
            glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                      (this_00,5,4,0x1405,&DAT_00000030,1,0xc,3);
            iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            GVar1 = *(GLsizei *)CONCAT44(extraout_var_16,iVar4);
            iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            glu::CallLogWrapper::glReadPixels
                      (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_17,iVar4) + 4),0x1907,
                       0x1406,fb.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar4 = *(int *)CONCAT44(extraout_var_18,iVar4);
            iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            iVar5 = *(int *)CONCAT44(extraout_var_19,iVar5);
            iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                      m_context)->m_renderCtx->_vptr_RenderContext[4])();
            bVar2 = VertexAttribBindingBase::CheckRectColor
                              (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                               *(int *)(CONCAT44(extraout_var_20,iVar6) + 4),rw,0x3f800000,
                               (Vec3 *)((ulong)in_stack_fffffffffffffe84 << 0x20));
            if (bVar2) {
              glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array[1]);
              glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                        (this_00,5,4,0x1405,(void *)0x20,1,8,2);
              iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              GVar1 = *(GLsizei *)CONCAT44(extraout_var_21,iVar4);
              iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              glu::CallLogWrapper::glReadPixels
                        (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_22,iVar4) + 4),0x1907,
                         0x1406,fb.
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              iVar4 = *(int *)CONCAT44(extraout_var_23,iVar4);
              iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              iVar5 = *(int *)CONCAT44(extraout_var_24,iVar5);
              iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                        m_context)->m_renderCtx->_vptr_RenderContext[4])();
              bVar2 = VertexAttribBindingBase::CheckRectColor
                                (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                                 *(int *)(CONCAT44(extraout_var_25,iVar6) + 4),rw,0,
                                 (Vec3 *)CONCAT44(in_stack_fffffffffffffe84,0x3f800000));
              if (bVar2) {
                glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                          (this_00,5,4,0x1405,(void *)0x0,1,0,0);
                iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                GVar1 = *(GLsizei *)CONCAT44(extraout_var_26,iVar4);
                iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                glu::CallLogWrapper::glReadPixels
                          (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_27,iVar4) + 4),
                           0x1907,0x1406,
                           fb.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                iVar4 = *(int *)CONCAT44(extraout_var_28,iVar4);
                iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                iVar5 = *(int *)CONCAT44(extraout_var_29,iVar5);
                iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
                          m_context)->m_renderCtx->_vptr_RenderContext[4])();
                bVar2 = VertexAttribBindingBase::CheckRectColor
                                  (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                                   *(int *)(CONCAT44(extraout_var_30,iVar6) + 4),rw,0x3f800000,
                                   (Vec3 *)((ulong)in_stack_fffffffffffffe84 << 0x20));
                if (bVar2) {
                  glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                            (this_00,5,4,0x1405,(void *)0x10,1,4,1);
                  iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper
                            .m_context)->m_renderCtx->_vptr_RenderContext[4])();
                  GVar1 = *(GLsizei *)CONCAT44(extraout_var_31,iVar4);
                  iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper
                            .m_context)->m_renderCtx->_vptr_RenderContext[4])();
                  glu::CallLogWrapper::glReadPixels
                            (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_32,iVar4) + 4),
                             0x1907,0x1406,
                             fb.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
                  iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper
                            .m_context)->m_renderCtx->_vptr_RenderContext[4])();
                  iVar4 = *(int *)CONCAT44(extraout_var_33,iVar4);
                  iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper
                            .m_context)->m_renderCtx->_vptr_RenderContext[4])();
                  iVar5 = *(int *)CONCAT44(extraout_var_34,iVar5);
                  iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper
                            .m_context)->m_renderCtx->_vptr_RenderContext[4])();
                  bVar2 = VertexAttribBindingBase::CheckRectColor
                                    (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                                     *(int *)(CONCAT44(extraout_var_35,iVar6) + 4),rw,0,
                                     (Vec3 *)((ulong)in_stack_fffffffffffffe84 << 0x20));
                  if (bVar2) {
                    glu::CallLogWrapper::glDrawElementsInstancedBaseVertexBaseInstance
                              (this_00,5,4,0x1405,&DAT_00000030,1,0xc,3);
                    iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.
                               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
                    GVar1 = *(GLsizei *)CONCAT44(extraout_var_36,iVar4);
                    iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.
                               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
                    glu::CallLogWrapper::glReadPixels
                              (this_00,0,0,GVar1,*(GLsizei *)(CONCAT44(extraout_var_37,iVar4) + 4),
                               0x1907,0x1406,
                               fb.
                               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                    iVar4 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.
                               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
                    iVar4 = *(int *)CONCAT44(extraout_var_38,iVar4);
                    iVar5 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.
                               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
                    iVar5 = *(int *)CONCAT44(extraout_var_39,iVar5);
                    iVar6 = (*((this->super_VertexAttribBindingBase).super_SubcaseBase.
                               super_GLWrapper.m_context)->m_renderCtx->_vptr_RenderContext[4])();
                    bVar2 = VertexAttribBindingBase::CheckRectColor
                                      (&this->super_VertexAttribBindingBase,&fb,iVar4,iVar5,
                                       *(int *)(CONCAT44(extraout_var_40,iVar6) + 4),rw,0x3f800000,
                                       (Vec3 *)((ulong)in_stack_fffffffffffffe84 << 0x20));
                    lVar7 = (ulong)bVar2 - 1;
                  }
                }
              }
            }
          }
        }
      }
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base(&fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   );
    }
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_ver = "#version 430 core\n";
		const char* const glsl =
			NL "#if defined(VS_PASS_THROUGH)" NL "layout(location = 0) in vec4 vs_in_position;" NL
			   "layout(location = 1) in vec3 vs_in_normal;" NL "layout(location = 2) in int vs_in_object_id;" NL
			   "out StageData {" NL "  float f;" NL "  vec3 normal;" NL "  int object_id;" NL "} vs_out;" NL
			   "out gl_PerVertex {" NL "  vec4 gl_Position;" NL "};" NL
			   "layout(binding = 0) uniform samplerBuffer g_transform_buffer;" NL "mat4 GetTransformMatrix(int id) {" NL
			   "  return mat4(texelFetch(g_transform_buffer, id * 4)," NL
			   "              texelFetch(g_transform_buffer, id * 4 + 1)," NL
			   "              texelFetch(g_transform_buffer, id * 4 + 2)," NL
			   "              texelFetch(g_transform_buffer, id * 4 + 3));" NL "}" NL "void main() {" NL
			   "  gl_Position = GetTransformMatrix(vs_in_object_id) * vs_in_position;" NL "  vs_out.f = 123.0;" NL
			   "  vs_out.normal = vs_in_normal;" NL "  vs_out.object_id = vs_in_object_id;" NL "}" NL
			   "#elif defined(FS_SOLID_COLOR)" NL "in StageData {" NL "  float f;" NL "  vec3 normal;" NL
			   "  flat int object_id;" NL "} fs_in;" NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL
			   "  if (fs_in.object_id == 0) g_color = vec4(1, 0, 0, 1);" NL
			   "  else if (fs_in.object_id == 1) g_color = vec4(0, 1, 0, 1);" NL
			   "  else if (fs_in.object_id == 2) g_color = vec4(0, 0, 1, 1);" NL
			   "  else if (fs_in.object_id == 3) g_color = vec4(1, 1, 0, 1);" NL "}" NL "#endif";
		/* VS_PASS_THROUGH */
		{
			const char* const src[] = { glsl_ver, "#define VS_PASS_THROUGH\n", glsl };
			m_vsp					= glCreateShaderProgramv(GL_VERTEX_SHADER, sizeof(src) / sizeof(src[0]), src);
		}
		/* FS_SOLID_COLOR */
		{
			const char* const src[] = { glsl_ver, "#define FS_SOLID_COLOR\n", glsl };
			m_fsp					= glCreateShaderProgramv(GL_FRAGMENT_SHADER, sizeof(src) / sizeof(src[0]), src);
		}
		if (!CheckProgram(m_vsp))
			return ERROR;
		if (!CheckProgram(m_fsp))
			return ERROR;

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_vsp);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_fsp);

		{
			const float data[] = { -0.5f, -0.5f, 1.0f,  0.0f, 0.0f,  1.5f,  -0.5f, 1.0f, 0.0f,  0.0f,  -0.5f, 1.5f,
								   1.0f,  0.0f,  0.0f,  1.5f, 1.5f,  1.0f,  0.0f,  0.0f, -1.5f, -0.5f, 0.0f,  1.0f,
								   0.0f,  0.5f,  -0.5f, 0.0f, 1.0f,  0.0f,  -1.5f, 1.5f, 0.0f,  1.0f,  0.0f,  0.5f,
								   1.5f,  0.0f,  1.0f,  0.0f, -1.5f, -1.5f, 0.0f,  0.0f, 1.0f,  0.5f,  -1.5f, 0.0f,
								   0.0f,  1.0f,  -1.5f, 0.5f, 0.0f,  0.0f,  1.0f,  0.5f, 0.5f,  0.0f,  0.0f,  1.0f,
								   -0.5f, -1.5f, 1.0f,  1.0f, 0.0f,  1.5f,  -1.5f, 1.0f, 1.0f,  0.0f,  -0.5f, 0.5f,
								   1.0f,  1.0f,  0.0f,  1.5f, 0.5f,  1.0f,  1.0f,  0.0f };
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		{
			const unsigned int data[] = { 0, 1, 2, 3, 0, 1, 2, 3, 0, 1, 2, 3, 0, 1, 2, 3 };
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		{
			const int data[] = { 0, 1, 2, 3 };
			glBindBuffer(GL_ARRAY_BUFFER, m_object_id_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		glBindVertexArray(m_vertex_array[0]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 8);
		glVertexAttribIFormat(2, 1, GL_INT, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glVertexAttribBinding(1, 0);
		glBindVertexBuffer(0, m_vertex_buffer, 0, 20);
		glBindVertexBuffer(2, m_object_id_buffer, 0, 4);
		glVertexBindingDivisor(2, 1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(m_vertex_array[1]);
		glVertexAttribFormat(0, 2, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribIFormat(2, 1, GL_INT, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glEnableVertexAttribArray(2);
		glVertexAttribBinding(2, 13);
		glVertexAttribBinding(1, 14);
		glVertexAttribBinding(0, 15);
		glBindVertexBuffer(15, m_vertex_buffer, 0, 20);
		glBindVertexBuffer(14, m_vertex_buffer, 8, 20);
		glBindVertexBuffer(13, m_object_id_buffer, 0, 4);
		glVertexBindingDivisor(13, 1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(0);

		{
			const Mat4 data[] = { Translation(-0.5f, -0.5f, 0.0f), Translation(0.5f, -0.5f, 0.0f),
								  Translation(0.5f, 0.5f, 0.0f), Translation(-0.5f, 0.5f, 0.0f) };
			glBindBuffer(GL_TEXTURE_BUFFER, m_transform_buffer);
			glBufferData(GL_TEXTURE_BUFFER, sizeof(data), &data, GL_DYNAMIC_DRAW);
			glBindBuffer(GL_TEXTURE_BUFFER, 0);
		}
		glBindTexture(GL_TEXTURE_BUFFER, m_transform_texture);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_transform_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindProgramPipeline(m_pipeline);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_BUFFER, m_transform_texture);
		glBindVertexArray(m_vertex_array[0]);

		std::vector<Vec3> fb(getWindowWidth() * getWindowHeight());
		bool			  status = true;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 0, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(4 * sizeof(unsigned int)), 1, 4, 1);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(8 * sizeof(unsigned int)), 1, 8, 2);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(12 * sizeof(unsigned int)), 1, 12, 3);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glBindVertexArray(m_vertex_array[1]);

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(8 * sizeof(unsigned int)), 1, 8, 2);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 0, 1)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT, 0, 1, 0, 0);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 0, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(4 * sizeof(unsigned int)), 1, 4, 1);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(0, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		glDrawElementsInstancedBaseVertexBaseInstance(GL_TRIANGLE_STRIP, 4, GL_UNSIGNED_INT,
													  (void*)(12 * sizeof(unsigned int)), 1, 12, 3);
		glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
		if (!CheckRectColor(fb, getWindowWidth(), 0, 0, getWindowWidth(), getWindowHeight(), Vec3(1, 1, 0)))
			status = false;
		if (!status)
			return ERROR;

		return NO_ERROR;
	}